

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O3

boolean in_your_sanctuary(monst *mon,xchar x,xchar y)

{
  permonst *ppVar1;
  boolean bVar2;
  char *pcVar3;
  monst *pri;
  char roomno;
  
  if (mon != (monst *)0x0) {
    ppVar1 = mon->data;
    if ((ppVar1 == mons + 0x145 || (ppVar1 == mons + 0x146 || ppVar1 == mons + 0x144)) ||
        (ppVar1->mflags2 & 0x2000) != 0) {
      return '\0';
    }
    x = mon->mx;
    y = mon->my;
  }
  if ((-4 < u.ualign.record) && (u.urooms[0] != '\0')) {
    pcVar3 = u.urooms;
    roomno = u.urooms[0];
    do {
      pcVar3 = pcVar3 + 1;
      if (*(char *)((long)level->monsters + (long)roomno * 0xd8 + 0x335c) == '\n') {
        pcVar3 = in_rooms(level,x,y,10);
        if (roomno != *pcVar3) {
          return '\0';
        }
        pri = findpriest(roomno);
        if (pri == (monst *)0x0) {
          return '\0';
        }
        bVar2 = has_shrine(pri);
        if (bVar2 == '\0') {
          return '\0';
        }
        if (u.ualign.type != pri->field_0x74) {
          return '\0';
        }
        return (byte)(*(uint *)&pri->field_0x60 >> 0x16) & 1;
      }
      roomno = *pcVar3;
    } while (roomno != '\0');
  }
  return '\0';
}

Assistant:

boolean in_your_sanctuary(struct monst *mon, /* if non-null, <mx,my> overrides <x,y> */
			  xchar x, xchar y)
{
	char roomno;
	struct monst *priest;

	if (mon) {
	    if (is_minion(mon->data) || is_rider(mon->data)) return FALSE;
	    x = mon->mx, y = mon->my;
	}
	if (u.ualign.record <= ALGN_SINNED)	/* sinned or worse */
	    return FALSE;
	if ((roomno = temple_occupied(u.urooms)) == 0 ||
		roomno != *in_rooms(level, x, y, TEMPLE))
	    return FALSE;
	if ((priest = findpriest(roomno)) == 0)
	    return FALSE;
	return (boolean)(has_shrine(priest) &&
			 p_coaligned(priest) &&
			 priest->mpeaceful);
}